

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cpp
# Opt level: O3

void __thiscall
entropy::entropy(entropy *this,float p_grid,float v_grid,int p_count,int v_count,float v,int _n)

{
  allocator_type aStack_88;
  allocator_type local_87;
  allocator_type local_86;
  allocator_type local_85;
  float local_84;
  float local_80;
  float local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_48;
  
  local_84 = p_grid;
  local_80 = v_grid;
  local_7c = v;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,(long)v_count,&local_85);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,(long)v_count,&local_78,&local_86);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_48,(long)p_count,&local_60,&local_87);
  std::
  vector<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  ::vector(&this->boxes,(long)p_count,&local_48,&aStack_88);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->position_box_size = local_84;
  this->velocity_box_size = local_80;
  this->position_box_count = p_count;
  this->velocity_box_count = v_count;
  this->velocity_limit = local_7c;
  this->n = _n;
  return;
}

Assistant:

entropy::entropy(float p_grid, float v_grid, int p_count, int v_count, float v, int _n) :
    boxes(p_count, vector<vector<vector<int>>>(p_count, vector<vector<int>>(v_count, vector<int>(v_count))))
{
    position_box_size = p_grid;
    velocity_box_size = v_grid;
    position_box_count = p_count;
    velocity_box_count = v_count;
    velocity_limit = v;
    n = _n;
}